

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O3

void __thiscall SkipList::Node::Node(Node *this,int inKey,Elem *inVal)

{
  pointer pcVar1;
  
  this->top = (Node *)0x0;
  this->bot = (Node *)0x0;
  this->prev = (Node *)0x0;
  this->next = (Node *)0x0;
  (this->val)._M_dataplus._M_p = (pointer)&(this->val).field_2;
  pcVar1 = (inVal->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->val,pcVar1,pcVar1 + inVal->_M_string_length);
  this->key = inKey;
  return;
}

Assistant:

SkipList::Node::Node(int inKey, const Elem& inVal) :
	key(inKey),
	val(inVal)
{}